

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

lbool __thiscall Minisat::SimpSolver::solve_(SimpSolver *this,bool do_simp,bool turn_off_simp)

{
  char *pcVar1;
  bool bVar2;
  lbool lVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  Var v;
  vec<int,_int> local_48;
  int local_34;
  
  local_48.data = (int *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  bVar6 = do_simp & this->use_simplification;
  lVar3.value = l_True;
  if (bVar6 == 1) {
    iVar4 = (this->super_Solver).assumptions.sz;
    if (0 < iVar4) {
      lVar7 = 0;
      do {
        local_34 = (this->super_Solver).assumptions.data[lVar7].x >> 1;
        if ((this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
            local_34) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, char>::operator[](K) const [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        if ((this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
            [local_34] != '\0') {
          __assert_fail("!isEliminated(v)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                        ,0x77,"lbool Minisat::SimpSolver::solve_(bool, bool)");
        }
        if ((this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= local_34
           ) goto LAB_0011013a;
        pcVar1 = (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
        if (pcVar1[local_34] == '\0') {
          pcVar1[local_34] = '\x01';
          vec<int,_int>::push(&local_48,&local_34);
          iVar4 = (this->super_Solver).assumptions.sz;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar4);
    }
    bVar2 = eliminate(this,turn_off_simp);
    lVar3.value = !bVar2;
  }
  bVar5 = lVar3.value & 2;
  if (lVar3.value == l_True && (l_True & 2) == 0 || (bVar5 & l_True) != 0) {
    lVar3 = Solver::solve_(&this->super_Solver);
    bVar5 = lVar3.value & 2;
  }
  else if (0 < (this->super_Solver).verbosity) {
    puts("===============================================================================");
  }
  if ((lVar3.value == l_True && (l_True & 2) == 0 || (bVar5 & l_True) != 0) &&
     (this->extend_model == true)) {
    extendModel(this);
  }
  if ((bVar6 != 0) && (0 < local_48.sz)) {
    lVar7 = 0;
    do {
      iVar4 = local_48.data[lVar7];
      if ((this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar4) {
LAB_0011013a:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,
                      "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar4] = '\0';
      if (this->use_simplification == true) {
        updateElimHeap(this,iVar4);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_48.sz);
  }
  if (local_48.data != (int *)0x0) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
    free(local_48.data);
  }
  return (lbool)lVar3.value;
}

Assistant:

lbool SimpSolver::solve_(bool do_simp, bool turn_off_simp)
{
    vec<Var> extra_frozen;
    lbool    result = l_True;

    do_simp &= use_simplification;

    if (do_simp){
        // Assumptions must be temporarily frozen to run variable elimination:
        for (int i = 0; i < assumptions.size(); i++){
            Var v = var(assumptions[i]);

            // If an assumption has been eliminated, remember it.
            assert(!isEliminated(v));

            if (!frozen[v]){
                // Freeze and store.
                setFrozen(v, true);
                extra_frozen.push(v);
            } }

        result = lbool(eliminate(turn_off_simp));
    }

    if (result == l_True)
        result = Solver::solve_();
    else if (verbosity >= 1)
        printf("===============================================================================\n");

    if (result == l_True && extend_model)
        extendModel();

    if (do_simp)
        // Unfreeze the assumptions that were frozen:
        for (int i = 0; i < extra_frozen.size(); i++)
            setFrozen(extra_frozen[i], false);

    return result;
}